

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O3

void CVmBifTIO::inputevent(uint argc)

{
  CVmObjPageEntry *this;
  anon_union_8_8_cb74652f_for_val aVar1;
  vm_val_t *pvVar2;
  vm_val_t *pvVar3;
  int32_t iVar4;
  int iVar5;
  vm_obj_id_t obj;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  char *pcVar9;
  vm_obj_id_t evt_00;
  size_t sVar10;
  CVmConsoleMain *pCVar11;
  unsigned_long timeout;
  int evt;
  char c [4];
  vm_val_t val;
  char keyname [32];
  os_event_info_t info;
  vm_obj_id_t local_170;
  char local_16c [4];
  vm_val_t local_168;
  char local_158 [40];
  os_event_info_t local_130;
  
  iVar6 = 0;
  CVmBif::check_argc_range(argc,0,1);
  if (argc == 0) {
    timeout = 0;
  }
  else if (sp_[-1].typ == VM_NIL) {
    sp_ = sp_ + -1;
    timeout = 0;
    iVar6 = 0;
  }
  else {
    iVar4 = CVmBif::pop_long_val();
    timeout = (unsigned_long)iVar4;
    iVar6 = 1;
  }
  iVar5 = CVmConsole::read_event_script
                    (&G_console_X->super_CVmConsole,(int *)&local_170,local_158 + 0x28,0x100,
                     inputevent::filter,6,(unsigned_long *)0x0);
  if (iVar5 == 0) {
    if (G_net_config_X == (TadsNetConfig *)0x0) {
      (*(G_console_X->super_CVmConsole)._vptr_CVmConsole[3])();
      CVmConsole::reset_line_count(&G_console_X->super_CVmConsole,0);
      local_170 = os_get_event(timeout,iVar6,(os_event_info_t *)(local_158 + 0x28));
      goto LAB_0022b8e0;
    }
    local_170 = 5;
LAB_0022b8f6:
    sVar10 = 1;
  }
  else if (local_170 == 0x100) {
    local_130.key[0] = atoi(local_158 + 0x28);
    sVar10 = 2;
  }
  else {
LAB_0022b8e0:
    sVar10 = 2;
    if (((local_170 != 1) && (local_170 != 3)) && (local_170 != 0x100)) goto LAB_0022b8f6;
  }
  obj = CVmObjList::create(0,sVar10);
  this = G_obj_table_X.pages_[obj >> 0xc] + (obj & 0xfff);
  uVar8 = (ulong)**(ushort **)((long)&this->ptr_ + 8);
  if (uVar8 != 0) {
    CVmObjList::cons_clear((CVmObjList *)this,0,uVar8 - 1);
  }
  pvVar2 = sp_;
  aVar1._4_4_ = local_168.val._4_4_;
  aVar1.obj = obj;
  pvVar3 = sp_ + 1;
  *(ulong *)sp_ = CONCAT44(local_168._4_4_,5);
  sp_ = pvVar3;
  pvVar2->val = aVar1;
  local_168.typ = VM_INT;
  local_168.val.intval = local_170;
  CVmObjList::cons_set_element((CVmObjList *)this,0,&local_168);
  if (local_170 == 0x100) {
    local_168.typ = VM_INT;
    local_168.val.intval = local_130.key[0];
    CVmObjList::cons_set_element((CVmObjList *)this,1,&local_168);
    pcVar9 = local_158;
    sprintf(pcVar9,"%d",(ulong)(uint)local_130.key[0]);
    pCVar11 = G_console_X;
    sVar7 = strlen(pcVar9);
    evt_00 = 0x100;
    iVar6 = 1;
  }
  else {
    if (local_170 == 3) {
      pcVar9 = local_158 + 0x28;
      local_168.val.obj = CVmBif::str_from_ui_str(pcVar9);
      local_168.typ = VM_OBJ;
      CVmObjList::cons_set_element((CVmObjList *)this,1,&local_168);
      pCVar11 = G_console_X;
      sVar7 = strlen(pcVar9);
      evt_00 = 3;
    }
    else {
      if (local_170 == 1) {
        if (iVar5 == 0) {
          if (local_130.key[0] == 0) {
            map_ext_key(local_158,local_130.key[1]);
            sVar7 = strlen(local_158);
            local_168.val.obj = CVmObjString::create(0,local_158,sVar7);
            pCVar11 = G_console_X;
            local_168.typ = VM_OBJ;
            sVar7 = strlen(local_158);
          }
          else {
            local_16c[0] = (char)local_130.key[0];
            iVar6 = (*(G_cmap_from_ui_X->super_CCharmap)._vptr_CCharmap[2])
                              (G_cmap_from_ui_X,local_16c,1);
            sVar10 = 1;
            if (iVar6 == 0) {
              uVar8 = 1;
              while (local_170 = os_get_event(0,0,(os_event_info_t *)(local_158 + 0x28)),
                    sVar10 = uVar8, local_170 == 1) {
                sVar10 = uVar8 + 1;
                local_16c[uVar8] = local_130.href[0];
                iVar6 = (*(G_cmap_from_ui_X->super_CCharmap)._vptr_CCharmap[2])
                                  (G_cmap_from_ui_X,local_16c,sVar10);
                if ((2 < uVar8) || (uVar8 = sVar10, iVar6 != 0)) break;
              }
            }
            map_raw_key(local_158,local_16c,sVar10);
            sVar7 = strlen(local_158);
            local_168.val.obj = CVmObjString::create(0,local_158,sVar7);
            pCVar11 = G_console_X;
            local_168.typ = VM_OBJ;
            sVar7 = strlen(local_158);
          }
          pcVar9 = local_158;
          iVar6 = 1;
        }
        else {
          pcVar9 = local_158 + 0x28;
          local_168.val.obj = CVmBif::str_from_ui_str(pcVar9);
          pCVar11 = G_console_X;
          local_168.typ = VM_OBJ;
          sVar7 = strlen(pcVar9);
          iVar6 = 0;
        }
        CVmConsole::log_event(&pCVar11->super_CVmConsole,1,pcVar9,sVar7,iVar6);
        CVmObjList::cons_set_element((CVmObjList *)this,1,&local_168);
        goto LAB_0022bbd4;
      }
      pcVar9 = (char *)0x0;
      sVar7 = 0;
      pCVar11 = G_console_X;
      evt_00 = local_170;
    }
    iVar6 = 0;
  }
  CVmConsole::log_event(&pCVar11->super_CVmConsole,evt_00,pcVar9,sVar7,iVar6);
LAB_0022bbd4:
  CVmBif::retval_obj(obj);
  sp_ = sp_ + -1;
  return;
}

Assistant:

void CVmBifTIO::inputevent(VMG_ uint argc)
{
    int use_timeout;
    unsigned long timeout;
    os_event_info_t info;
    int evt;
    int ele_count;
    vm_obj_id_t lst_obj;
    CVmObjList *lst;
    char keyname[32];
    vm_val_t val;
    int from_script = FALSE;
    static const int filter[] =
    {
        OS_EVT_KEY, OS_EVT_TIMEOUT, OS_EVT_NOTIMEOUT,
        OS_EVT_HREF, OS_EVT_EOF, OS_EVT_COMMAND
    };

    /* check arguments */
    check_argc_range(vmg_ argc, 0, 1);

    /* if there's a timeout argument, get it */
    if (argc == 0)
    {
        /* there's no timeout */
        use_timeout = FALSE;
        timeout = 0;
    }
    else if (G_stk->get(0)->typ == VM_NIL)
    {
        /* the timeout is nil, which is the same as no timeout */
        use_timeout = FALSE;
        timeout = 0;

        /* discard the nil timeout value */
        G_stk->discard();
    }
    else
    {
        /* pop the timeout value */
        timeout = pop_long_val(vmg0_);

        /* note that we have a timeout to use */
        use_timeout = TRUE;
    }

    /* check for script input */
    if (G_console->read_event_script(
        vmg_ &evt, info.href, sizeof(info.href),
        filter, sizeof(filter)/sizeof(filter[0]), 0))
    {
        /* we got a script event - note it */
        from_script = TRUE;

        /* translate certain events */
        switch (evt)
        {
        case OS_EVT_COMMAND:
            /* read the numeric parameter */
            info.cmd_id = atoi(info.href);
            break;
        }
    }
    else if (G_net_config != 0)
    {
        /* there's no console in web host mode - return eof */
        evt = OS_EVT_EOF;
    }
    else
    {
        /* flush any buffered output */
        G_console->flush_all(vmg_ VM_NL_INPUT);

        /* reset the [MORE] counter */
        G_console->reset_line_count(FALSE);

        /* read an event from the OS layer */
        evt = os_get_event(timeout, use_timeout, &info);
    }

    /* figure out how big a list we need to allocate */
    switch(evt)
    {
    case OS_EVT_KEY:
        /* 
         *   we need two elements - one for the event type code, one for the
         *   keystroke string 
         */
        ele_count = 2;
        break;

    case OS_EVT_COMMAND:
        /* we need a second element for the command ID */
        ele_count = 2;
        break;

    case OS_EVT_HREF:
        /* 
         *   we need two elements - one for the event type code, one for the
         *   HREF string 
         */
        ele_count = 2;
        break;

    default:
        /* for anything else, we need only the event type code element */
        ele_count = 1;
        break;
    }

    /* create the return list */
    lst_obj = CVmObjList::create(vmg_ FALSE, ele_count);
    lst = (CVmObjList *)vm_objp(vmg_ lst_obj);
    lst->cons_clear();

    /* save the list on the stack to protect against garbage collection */
    val.set_obj(lst_obj);
    G_stk->push(&val);

    /* fill in the first element with the event type code */
    val.set_int(evt);
    lst->cons_set_element(0, &val);

    /* set additional elements, according to the event type */
    switch(evt)
    {
    case OS_EVT_KEY:
        /* map the extended or ordinary key, as appropriate */
        if (from_script)
        {
            /* we got a key from the script - it's in the 'href' field */
            val.set_obj(str_from_ui_str(vmg_ info.href));

            /* log the event */
            G_console->log_event(
                vmg_ OS_EVT_KEY, info.href, strlen(info.href), FALSE);
        }
        else if (info.key[0] == 0)
        {
            /* it's an extended key */
            map_ext_key(vmg_ keyname, info.key[1]);

            /* create a string for the key name */
            val.set_obj(CVmObjString::create(
                vmg_ FALSE, keyname, strlen(keyname)));

            /* log the event */
            G_console->log_event(
                vmg_ OS_EVT_KEY, keyname, strlen(keyname), TRUE);
        }
        else
        {
            char c[4];
            size_t len;

            /* fetch more bytes until we have a complete character */
            for (c[0] = (char)info.key[0], len = 1 ;
                 !raw_key_complete(vmg_ c, len) && len < sizeof(c) ; )
            {
                /* 
                 *   Read another input event.  The keyboard driver should
                 *   already have queued up all of the bytes needed to
                 *   complete this character sequence, so there should never
                 *   be a delay from os_get_event() here - it should simply
                 *   return immediately with another OS_EVT_KEY event with
                 *   the next byte of the sequence.  
                 */
                evt = os_get_event(0, FALSE, &info);

                /* 
                 *   if it's not a keystroke event, something's wrong -
                 *   ignore the event and stop trying to read the remaining
                 *   bytes of the character sequence 
                 */
                if (evt != OS_EVT_KEY)
                    break;

                /* store the next byte of the sequence */
                c[len++] = (char)info.key[0];
            }

            /* it's an ordinary key - map it */
            map_raw_key(vmg_ keyname, c, len);

            /* create a string for the key name */
            val.set_obj(CVmObjString::create(
                vmg_ FALSE, keyname, strlen(keyname)));

            /* log the event */
            G_console->log_event(
                vmg_ OS_EVT_KEY, keyname, strlen(keyname), TRUE);
        }

        /* add it to the list */
        lst->cons_set_element(1, &val);

        break;

    case OS_EVT_HREF:
        /* create the string for the href text */
        val.set_obj(str_from_ui_str(vmg_ info.href));

        /* add it to the list */
        lst->cons_set_element(1, &val);

        /* log it */
        G_console->log_event(vmg_ OS_EVT_HREF,
                             info.href, strlen(info.href), FALSE);
        break;

    case OS_EVT_COMMAND:
        /* the second element is the command ID code */
        val.set_int(info.cmd_id);
        lst->cons_set_element(1, &val);

        /* log it */
        {
            char buf[20];
            sprintf(buf, "%d", info.cmd_id);
            G_console->log_event(vmg_ OS_EVT_COMMAND,
                                 buf, strlen(buf), TRUE);
        }
        break;

    default:
        /* other event types have no extra data */
        G_console->log_event(vmg_ evt);
        break;
    }

    /* return the list */
    retval_obj(vmg_ lst_obj);

    /* we can drop the garbage collection protection now */
    G_stk->discard();
}